

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void init_altrace_record(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  char *local_60;
  int local_3c;
  char *filename;
  int rc;
  int okay;
  char **argv_local;
  int argc_local;
  
  fprintf(_stderr,"\n\n\n%s: starting up...\n",GAppName);
  fflush(_stderr);
  iVar3 = init_clock();
  if (iVar3 == 0) {
    fflush(_stderr);
    _exit(0x2a);
  }
  iVar3 = load_real_openal();
  if (iVar3 != 0) {
    iVar3 = pthread_mutex_init((pthread_mutex_t *)&_apilock,(pthread_mutexattr_t *)0x0);
    pFVar2 = _stderr;
    pcVar5 = GAppName;
    if (iVar3 != 0) {
      pcVar4 = strerror(iVar3);
      fprintf(pFVar2,"%s: Failed to create mutex: %s\n",pcVar5,pcVar4);
    }
    bVar1 = iVar3 == 0;
    apilock = &_apilock;
    if (bVar1) {
      pcVar5 = choose_tracefile_name(argc,argv);
      if (pcVar5 == (char *)0x0) {
        local_3c = -1;
      }
      else {
        local_3c = open(pcVar5,0x241,0x1a4);
      }
      pFVar2 = _stderr;
      pcVar4 = GAppName;
      logfd = local_3c;
      if (local_3c == -1) {
        if (pcVar5 == (char *)0x0) {
          local_60 = "Out of memory";
        }
        else {
          piVar6 = __errno_location();
          local_60 = strerror(*piVar6);
        }
        fprintf(pFVar2,"%s: Failed to open OpenAL log file \'%s\': %s\n",pcVar4,pcVar5,local_60);
        bVar1 = false;
      }
      else {
        fprintf(_stderr,"%s: Recording OpenAL session to log file \'%s\'\n\n\n",GAppName,pcVar5);
      }
      free(pcVar5);
    }
    fflush(_stderr);
    if (bVar1) {
      IO_UINT32(0x104e5a1);
      IO_UINT32(1);
      return;
    }
    quit_altrace_record();
    _exit(0x2a);
  }
  _exit(0x2a);
}

Assistant:

static void init_altrace_record(int argc, char **argv)
{
    int okay = 1;

    fprintf(stderr, "\n\n\n%s: starting up...\n", GAppName);
    fflush(stderr);

    if (!init_clock()) {
        fflush(stderr);
        _exit(42);
    }

    if (!load_real_openal()) {
        _exit(42);
    }

    if (okay) {
        const int rc = pthread_mutex_init(&_apilock, NULL);
        if (rc != 0) {
            fprintf(stderr, "%s: Failed to create mutex: %s\n", GAppName, strerror(rc));
            okay = 0;
        }
        apilock = &_apilock;
    }

    if (okay) {
        char *filename = choose_tracefile_name(argc, argv);
        logfd = filename ? open(filename, O_WRONLY | O_TRUNC | O_CREAT, 0644) : -1;
        if (logfd == -1) {
            fprintf(stderr, "%s: Failed to open OpenAL log file '%s': %s\n", GAppName, filename, filename ? strerror(errno) : "Out of memory");
            okay = 0;
        } else {
            fprintf(stderr, "%s: Recording OpenAL session to log file '%s'\n\n\n", GAppName, filename);
        }
        free(filename);
    }

    fflush(stderr);

    if (!okay) {
        quit_altrace_record();
        _exit(42);
    }

    IO_UINT32(ALTRACE_LOG_FILE_MAGIC);
    IO_UINT32(ALTRACE_LOG_FILE_FORMAT);
}